

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shq_que.c
# Opt level: O3

QcShmQue * shm_queue_find(QcShm *qcShm,char *que_name,QcErr *err)

{
  int iVar1;
  char *pcVar2;
  QcShmQue *__ptr;
  QcSem *pQVar3;
  P_ShmQue *__s1;
  
  pcVar2 = qc_shm_getaddr(qcShm);
  __s1 = (P_ShmQue *)(pcVar2 + 8);
  iVar1 = strcmp((char *)__s1,que_name);
  while (iVar1 != 0) {
    if (__s1->next_offset == -1) {
      qc_seterr(err,-1,"que_name (%s) not found in shm.",que_name);
      return (QcShmQue *)0x0;
    }
    pcVar2 = qc_shm_getaddr(qcShm);
    __s1 = (P_ShmQue *)(pcVar2 + __s1->next_offset);
    iVar1 = strcmp((char *)__s1,que_name);
  }
  __ptr = (QcShmQue *)malloc(0x20);
  __ptr->p_shmQue = __s1;
  pQVar3 = qc_sem_open(__s1->semname_que,err);
  __ptr->sem_que = pQVar3;
  if (pQVar3 != (QcSem *)0x0) {
    pQVar3 = qc_sem_open(__s1->semname_lst,err);
    __ptr->sem_lst = pQVar3;
    if (pQVar3 != (QcSem *)0x0) {
      __ptr->qcShm = qcShm;
      return __ptr;
    }
    qc_sem_destroy(__ptr->sem_que);
  }
  free(__ptr);
  return (QcShmQue *)0x0;
}

Assistant:

QcShmQue* shm_queue_find(QcShm *qcShm, const char *que_name, QcErr *err)
{
    off_t offset;
    P_ShmQue *p_shmQue;

    offset = sizeof(P_Shmem);
    p_shmQue = (P_ShmQue*)(qc_shm_getaddr(qcShm) + offset);

    while(1)
    {
        if(strcmp(p_shmQue->quename, que_name) == 0)
        {
            QcShmQue* shmQue = malloc(sizeof(QcShmQue));
            shmQue->p_shmQue = p_shmQue;

            shmQue->sem_que = qc_sem_open(p_shmQue->semname_que, err);
            if (NULL == shmQue->sem_que)
            {
                free(shmQue);
                return NULL;
            }

            shmQue->sem_lst = qc_sem_open(p_shmQue->semname_lst, err);
            if (NULL == shmQue->sem_lst)
            {
                qc_sem_destroy(shmQue->sem_que);
                free(shmQue);
                return NULL;
            }

            shmQue->qcShm = qcShm;
            return shmQue;
        }

        if(-1 == p_shmQue->next_offset)
        {
            qc_seterr(err, -1, "que_name (%s) not found in shm.", que_name);
            return NULL;
        }

        p_shmQue = (P_ShmQue*)((char*)qc_shm_getaddr(qcShm) + p_shmQue->next_offset);
    }
}